

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::TrackIntegrate
          (Recycler *this,char *blockAddress,size_t blockSize,size_t allocSize,size_t objectSize,
          TrackAllocData *trackAllocData)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *object;
  
  if (this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) {
    return;
  }
  bVar2 = TrackAllocData::IsEmpty(&this->nextAllocData);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x204b,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
  object = blockAddress;
  while (object + allocSize <= blockAddress + blockSize) {
    TrackAllocCore(this,object,objectSize,trackAllocData,false);
    object = object + allocSize;
  }
  CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
  return;
}

Assistant:

void
Recycler::TrackIntegrate(__in_ecount(blockSize) char * blockAddress, size_t blockSize, size_t allocSize, size_t objectSize, const TrackAllocData& trackAllocData)
{
    if (this->trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty()); // should have been cleared
        trackerCriticalSection->Enter();

        char * address = blockAddress;
        char * blockEnd = blockAddress + blockSize;
        while (address + allocSize <= blockEnd)
        {
            TrackAllocCore(address, objectSize, trackAllocData);
            address += allocSize;
        }

        trackerCriticalSection->Leave();
    }
}